

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error.h
# Opt level: O0

void pbrt::ErrorExit<std::__cxx11::string_const&>
               (char *fmt,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args)

{
  char *message;
  FileLoc *in_stack_ffffffffffffffc0;
  char local_30 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffe0;
  char *in_stack_ffffffffffffffe8;
  
  message = local_30;
  StringPrintf<std::__cxx11::string_const&>(in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0);
  std::__cxx11::string::c_str();
  ErrorExit(in_stack_ffffffffffffffc0,message);
}

Assistant:

[[noreturn]] inline void ErrorExit(const char *fmt, Args &&... args) {
    ErrorExit(nullptr, StringPrintf(fmt, std::forward<Args>(args)...).c_str());
}